

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpunit.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  uint uVar76;
  uint uVar77;
  yabmp_uint32 l_v0;
  uint l_v4;
  yabmp_q16d16 gr;
  yabmp_uint32 l_v3;
  yabmp_uint32 l_v1;
  yabmp_uint32 major2;
  yabmp_q16d16 gb;
  uint l_v6;
  yabmp_uint32 minor2;
  yabmp_uint32 minor;
  yabmp_uint32 major;
  yabmp_q16d16 gg;
  uint l_v7;
  uint l_v5;
  yabmp_uint32 l_v2;
  yabmp_uint32 patch;
  yabmp_uint32 patch2;
  yabmp_color *l_lut;
  undefined1 local_a8 [4];
  uint local_a4;
  undefined1 local_a0 [4];
  undefined1 local_9c [4];
  undefined1 local_98 [4];
  undefined1 local_94 [4];
  undefined8 local_90;
  undefined1 local_88 [4];
  undefined1 local_84 [4];
  uint local_80 [2];
  ulong local_78 [2];
  ulong local_68;
  undefined1 local_5c [4];
  undefined1 local_58 [4];
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  uint local_4c [3];
  uint local_40 [2];
  undefined1 local_38 [8];
  
  local_68 = local_68 & 0xffffffff00000000;
  local_78[0] = local_78[0] & 0xffffffff00000000;
  local_4c[0] = 0;
  local_90 = CONCAT44(local_90._4_4_,1);
  local_80[0] = 1;
  local_40[0] = 1;
  yabmp_get_version(0,0,0);
  yabmp_get_version(&local_68,local_78,local_4c);
  yabmp_get_version(&local_90,0,0);
  yabmp_get_version(0,local_80,0);
  yabmp_get_version(0,0,local_40);
  uVar1 = (uint)local_68 ^ (uint)local_90;
  uVar76 = (uint)local_78[0] ^ local_80[0];
  uVar77 = local_4c[0] ^ local_40[0];
  local_68 = 0;
  uVar2 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,custom_malloc,0);
  uVar3 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,0,custom_free);
  uVar4 = yabmp_create_reader(0,0,print_error,print_warning,0,0,custom_free);
  uVar5 = yabmp_create_reader(0,0,print_error,print_warning,0,0,0);
  uVar6 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,custom_malloc,custom_free);
  uVar7 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,custom_malloc,custom_free);
  yabmp_destroy_reader(&local_68);
  local_68 = 0;
  uVar8 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,0,0);
  uVar9 = yabmp_set_input_stream(0,0,0,0,0);
  uVar10 = yabmp_set_input_stream(local_68,0,0,0,0);
  uVar11 = yabmp_set_input_stream(local_68,0,0,custom_seek,0);
  uVar12 = yabmp_set_input_stream(local_68,0,0,0,custom_close);
  uVar13 = yabmp_set_input_stream(local_68,0,custom_read,0,0);
  uVar14 = yabmp_set_input_stream(local_68,0,custom_read,custom_seek);
  yabmp_destroy_reader(&local_68);
  uVar15 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,0,0);
  uVar16 = yabmp_set_input_file(0,0);
  uVar17 = yabmp_set_input_file(local_68,0);
  uVar18 = yabmp_set_input_file();
  uVar19 = yabmp_set_input_memory(0,0,0);
  uVar20 = yabmp_set_input_memory(local_68,0,0);
  uVar21 = yabmp_set_input_memory(local_68,local_68,0);
  yabmp_destroy_reader(&local_68);
  local_68 = 0;
  local_78[0] = 0;
  uVar22 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,0,0);
  uVar23 = yabmp_create_info(0,0);
  uVar24 = yabmp_create_info(local_68,0);
  uVar25 = yabmp_create_info(0,local_78);
  local_78[0] = local_68;
  uVar26 = yabmp_create_info(local_68,local_78);
  local_78[0] = 0;
  uVar27 = yabmp_create_info(local_68,local_78);
  uVar28 = yabmp_read_info(0,0);
  uVar29 = yabmp_read_info(local_68,0);
  uVar30 = yabmp_read_info(0,local_78[0]);
  uVar31 = yabmp_read_info(local_68);
  uVar32 = yabmp_set_input_stream(local_68,0,custom_read,0);
  uVar33 = yabmp_read_info(local_68,local_78[0]);
  yabmp_destroy_reader(&local_68);
  local_90 = 0;
  uVar34 = yabmp_create_reader(&local_90,0,print_error,print_warning,0,0,0);
  uVar35 = yabmp_get_dimensions(0,local_80,local_a8,local_94);
  uVar36 = yabmp_get_dimensions(local_90,0,local_a8,local_94);
  uVar37 = yabmp_get_dimensions(local_90,local_80,0,0);
  uVar38 = yabmp_get_pixels_per_meter(0,local_80,local_a8,local_94);
  uVar39 = yabmp_get_pixels_per_meter(local_90,0,local_a8,local_94);
  uVar40 = yabmp_get_pixels_per_meter(local_90,local_80,0,0);
  uVar41 = yabmp_get_bit_depth(0,local_80,local_a0);
  uVar42 = yabmp_get_bit_depth(local_90,0,local_a0);
  uVar43 = yabmp_get_bit_depth(local_90,local_80,0);
  uVar44 = yabmp_get_color_type(0,local_80,local_a0);
  uVar45 = yabmp_get_color_type(local_90,0,local_a0);
  uVar46 = yabmp_get_color_type(local_90,local_80,0);
  uVar47 = yabmp_get_compression_type(0,local_80,local_a8);
  uVar48 = yabmp_get_compression_type(local_90,0,local_a8);
  uVar49 = yabmp_get_compression_type(local_90,local_80,0);
  uVar50 = yabmp_get_scan_direction(0,local_80,local_a0);
  uVar51 = yabmp_get_scan_direction(local_90,0,local_a0);
  uVar52 = yabmp_get_scan_direction(local_90,local_80,0);
  uVar53 = yabmp_get_bitfields(0,local_80,local_a8,local_94,local_50,local_98);
  uVar54 = yabmp_get_bitfields(local_90,0,local_a8,local_94,local_50,local_98);
  uVar55 = yabmp_get_bitfields(local_90,local_80,0,local_94,local_50,local_98);
  uVar56 = yabmp_get_bitfields(local_90,local_80,local_a8,0,local_50,local_98);
  uVar57 = yabmp_get_bitfields(local_90,local_80,local_a8,local_94,0,local_98);
  uVar58 = yabmp_get_bitfields(local_90,local_80,local_a8,local_94,local_50,0);
  uVar59 = yabmp_get_bits(0,local_80,local_a0,local_54,local_84,local_58);
  uVar60 = yabmp_get_bits(local_90,0,local_a0,local_54,local_84,local_58);
  uVar61 = yabmp_get_bits(local_90,local_80,0,local_54,local_84,local_58);
  local_a4 = uVar61 ^ 3 |
             uVar60 ^ 3 |
             uVar59 ^ 3 |
             uVar58 ^ 3 |
             uVar57 ^ 3 | uVar56 ^ 3 | uVar55 ^ 3 | uVar54 ^ 3 | uVar53 ^ 3 | uVar52 ^ 3 |
             uVar51 ^ 3 |
             uVar50 ^ 3 |
             uVar49 ^ 3 |
             uVar48 ^ 3 | uVar47 ^ 3 | uVar46 ^ 3 | uVar45 ^ 3 | uVar44 ^ 3 | uVar43 ^ 3 |
             uVar42 ^ 3 |
             uVar41 ^ 3 |
             uVar40 ^ 3 | uVar39 ^ 3 | uVar38 ^ 3 | uVar37 ^ 3 | uVar36 ^ 3 | uVar35 ^ 3 |
             uVar34 | uVar33 ^ 1 | uVar32 | uVar31 ^ 1 | uVar30 ^ 3 | uVar29 ^ 3 | uVar28 ^ 3 |
             uVar27 | uVar26 ^ 3 | uVar25 ^ 3 | uVar24 ^ 3 | uVar23 ^ 3 | uVar22 | uVar21 |
             uVar20 ^ 3 | uVar19 ^ 3 | uVar18 ^ 1 | uVar17 ^ 3 | uVar16 ^ 3 |
             uVar15 | uVar14 ^ 1 | uVar13 | uVar12 ^ 3 |
             uVar11 ^ 3 | uVar10 ^ 3 | uVar9 ^ 3 |
             uVar8 | uVar7 ^ 3 | uVar6 | uVar5 ^ 3 | uVar4 ^ 3 | uVar3 ^ 3 |
             uVar2 ^ 3 | uVar77 | uVar76 | uVar1;
  uVar1 = yabmp_get_bits(local_90,local_80,local_a0,0,local_84,local_58);
  uVar2 = yabmp_get_bits(local_90,local_80,local_a0,local_54,0,local_58);
  uVar3 = yabmp_get_bits(local_90,local_80,local_a0,local_54,local_84,0);
  uVar4 = yabmp_get_palette(0,local_80,local_a0,local_38);
  uVar5 = yabmp_get_palette(local_90,0,local_a0,local_38);
  uVar6 = yabmp_get_palette(local_90,local_80,0,local_38);
  uVar7 = yabmp_get_palette(local_90,local_80,local_a0,0);
  uVar8 = yabmp_get_rowbytes(0,local_80,local_40);
  uVar9 = yabmp_get_rowbytes(local_90,0,local_40);
  uVar10 = yabmp_get_rowbytes(local_90,local_80,0);
  uVar11 = yabmp_get_color_profile_type(0,local_80,local_a0);
  local_a4 = uVar11 ^ 3 |
             uVar10 ^ 3 |
             uVar9 ^ 3 |
             uVar8 ^ 3 |
             uVar7 ^ 3 | uVar6 ^ 3 | uVar5 ^ 3 | uVar4 ^ 3 | uVar3 ^ 3 | uVar2 ^ 3 | uVar1 ^ 3 |
             local_a4;
  uVar1 = yabmp_get_color_profile_type(local_90,0,local_a0);
  uVar2 = yabmp_get_color_profile_type(local_90,local_80,0);
  uVar3 = yabmp_get_color_profile_intent(0,local_80,local_a0);
  uVar4 = yabmp_get_color_profile_intent(local_90,0,local_a0);
  uVar5 = yabmp_get_color_profile_intent(local_90,local_80,0);
  uVar6 = yabmp_get_color_profile_icc_data(0,local_80,local_80,local_94);
  uVar7 = yabmp_get_color_profile_icc_data(local_90,0,local_80,local_94);
  uVar8 = yabmp_get_color_profile_icc_data(local_90,local_80,0,local_94);
  uVar9 = yabmp_get_color_profile_icc_data(local_90,local_80,local_80,0);
  uVar10 = yabmp_get_color_profile_calibration
                     (0,local_80,&local_68,local_78,local_4c,local_9c,local_5c,local_88);
  uVar11 = yabmp_get_color_profile_calibration
                     (local_90,0,&local_68,local_78,local_4c,local_9c,local_5c,local_88);
  uVar12 = yabmp_get_color_profile_calibration
                     (local_90,local_80,0,local_78,local_4c,local_9c,local_5c,local_88);
  local_a4 = uVar12 ^ 3 |
             uVar11 ^ 3 |
             uVar10 ^ 3 |
             uVar9 ^ 3 |
             uVar8 ^ 3 |
             uVar7 ^ 3 | uVar6 ^ 3 | uVar5 ^ 3 | uVar4 ^ 3 | uVar3 ^ 3 | uVar2 ^ 3 | uVar1 ^ 3 |
             local_a4;
  iVar62 = yabmp_get_color_profile_calibration
                     (local_90,local_80,&local_68,0,local_4c,local_9c,local_5c,local_88);
  iVar63 = yabmp_get_color_profile_calibration
                     (local_90,local_80,&local_68,local_78,0,local_9c,local_5c,local_88);
  iVar64 = yabmp_get_color_profile_calibration
                     (local_90,local_80,&local_68,local_78,local_4c,0,local_5c,local_88);
  iVar65 = yabmp_get_color_profile_calibration
                     (local_90,local_80,&local_68,local_78,local_4c,local_9c,0,local_88);
  iVar66 = yabmp_get_color_profile_calibration
                     (local_90,local_80,&local_68,local_78,local_4c,local_9c,local_5c,0);
  iVar67 = yabmp_read_update_info(local_90);
  yabmp_destroy_reader(&local_90);
  local_68 = 0;
  iVar68 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,0,0);
  iVar69 = yabmp_read_row(local_68,1,0);
  iVar70 = yabmp_read_row(0,1,0);
  iVar71 = yabmp_read_row(local_68,0,0);
  yabmp_destroy_reader(&local_68,0);
  local_68 = 0;
  iVar72 = yabmp_create_reader(&local_68,0,print_error,print_warning,0,0,0);
  iVar73 = yabmp_set_invert_scan_direction();
  iVar74 = yabmp_set_expand_to_bgrx();
  uVar1 = local_a4;
  iVar75 = yabmp_set_expand_to_grayscale(0);
  yabmp_destroy_reader(&local_68,0);
  return (int)(iVar75 != 3 ||
              ((iVar74 != 3 ||
               (iVar73 != 3 ||
               (iVar72 != 0 ||
               (iVar71 != 3 ||
               (iVar70 != 3 ||
               (iVar69 != 1 ||
               (iVar68 != 0 ||
               (iVar67 != 3 ||
               (iVar66 != 3 || (iVar65 != 3 || (iVar64 != 3 || (iVar63 != 3 || iVar62 != 3))))))))))
               )) || uVar1 != 0));
}

Assistant:

int main(int argc, char* argv[])
{
	int result = EXIT_SUCCESS;
	
	/* test version */
	{
		yabmp_uint32 major  = 0U, minor  = 0U, patch  = 0U;
		yabmp_uint32 major2 = 1U, minor2 = 1U, patch2 = 1U;
		
		yabmp_get_version(NULL,    NULL,    NULL); /* check this doesn't crash */
		yabmp_get_version(&major,  &minor,  &patch);
		yabmp_get_version(&major2, NULL,    NULL);
		yabmp_get_version(NULL,    &minor2, NULL);
		yabmp_get_version(NULL,    NULL,    &patch2);
		
		result |= (((major^major2) | (minor^minor2) | (patch^patch2)) == 0U) ? EXIT_SUCCESS : EXIT_FAILURE;
	}
	
	/* test args error for yabmp_create_reader */
	{
		yabmp* l_reader = NULL;
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, custom_malloc, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, custom_free) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(NULL, NULL, print_error, print_warning, NULL, NULL, custom_free) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(NULL, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, custom_malloc, custom_free) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, custom_malloc, custom_free) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	/* test args error for yabmp_set_input_stream */
	{
		yabmp* l_reader = NULL;
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_set_input_stream(NULL, NULL, NULL, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, NULL, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, NULL, custom_seek, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, NULL, NULL, custom_close) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, custom_seek, custom_close) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_file(NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_file(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_file(l_reader, "dummy/directory/that/does/not/exist/file.txt") == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_set_input_memory(NULL, NULL, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_memory(l_reader, NULL, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_memory(l_reader, l_reader, 0U) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
		
	}
	
	/* test args error for yabmp_read_info */
	{
		yabmp* l_reader = NULL;
		yabmp_info* l_info = NULL;
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_create_info(NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_create_info(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_create_info(NULL, &l_info) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		l_info = (yabmp_info*)l_reader;
		result |= (yabmp_create_info(l_reader, &l_info) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		l_info = NULL;
		result |= (yabmp_create_info(l_reader, &l_info) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		
		result |= (yabmp_read_info(NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(NULL, l_info) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader, l_info) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader, l_info) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, &l_info);
	}
	
	/* test args error for yabmp_get_* (yabmp_info.c) */
	{
		yabmp* l_reader = NULL;
		yabmp_uint32 l_v0, l_v1, l_v2, l_v3;
		unsigned int l_v4, l_v5, l_v6, l_v7;
		yabmp_cie_xyz r, g, b;
		yabmp_q16d16 gr, gg, gb;
		yabmp_uint8 const* l_data;
		size_t l_v8;
		yabmp_color const *l_lut;
		yabmp_info* l_info = (yabmp_info*)&l_data;
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		/*
		TODO test before readinfo, shall fail
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		*/
		
		result |= (yabmp_get_dimensions(NULL, l_info, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_dimensions(l_reader, NULL, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_dimensions(l_reader, l_info, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_pixels_per_meter(NULL, l_info, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_pixels_per_meter(l_reader, NULL, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_pixels_per_meter(l_reader, l_info, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_bit_depth(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bit_depth(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bit_depth(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_type(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_type(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_type(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_compression_type(NULL, l_info, &l_v0) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_compression_type(l_reader, NULL, &l_v0) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_compression_type(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_scan_direction(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_scan_direction(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_scan_direction(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		
		result |= (yabmp_get_bitfields(NULL, l_info, &l_v0, &l_v1, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, NULL, &l_v0, &l_v1, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, NULL, &l_v1, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, &l_v0, NULL, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, &l_v0, &l_v1, NULL, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, &l_v0, &l_v1, &l_v2, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_bits(NULL, l_info, &l_v4, &l_v5, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, NULL, &l_v4, &l_v5, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, NULL, &l_v5, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, &l_v4, NULL, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, &l_v4, &l_v5, NULL, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, &l_v4, &l_v5, &l_v6, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_palette(NULL, l_info, &l_v4, &l_lut) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_palette(l_reader, NULL, &l_v4, &l_lut) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_palette(l_reader, l_info, NULL, &l_lut) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_palette(l_reader, l_info, &l_v4, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_rowbytes(NULL, l_info, &l_v8) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_rowbytes(l_reader, NULL, &l_v8) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_rowbytes(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_type(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_type(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_type(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_intent(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_intent(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_intent(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_icc_data(NULL, l_info, &l_data, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_icc_data(l_reader, NULL, &l_data, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_icc_data(l_reader, l_info, NULL, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_icc_data(l_reader, l_info, &l_data, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_calibration(NULL, l_info, &r, &g, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, NULL, &r, &g, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, NULL, &g, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, NULL, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, NULL, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, &b, NULL, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, &b, &gr, NULL, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, &b, &gr, &gg, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_read_update_info(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	/* test args error for yabmp_read_row */
	{
		yabmp* l_reader = NULL;
		void* l_row = (void*)1U;
		
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_read_row(l_reader, l_row, 0U) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		/*
		 result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		 result |= (yabmp_read_info(l_reader) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		 */
		
		result |= (yabmp_read_row(NULL, l_row, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_row(l_reader, NULL, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	/* test args error for yabmp_set_* transforms */
	{
		yabmp* l_reader = NULL;
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		/*
		 TODO test before readinfo, shall fail
		 result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		 result |= (yabmp_read_info(l_reader) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		 */
		
		result |= (yabmp_set_invert_scan_direction(NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_expand_to_bgrx(NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_expand_to_grayscale(NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	return result;
	
}